

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

bool chaiscript::ChaiScript_Basic::skip_bom(ifstream *infile)

{
  fpos<__mbstate_t> local_48;
  fpos<__mbstate_t> local_38;
  char local_23;
  char local_22;
  char local_21;
  undefined8 uStack_20;
  char buffer [3];
  size_t bytes_needed;
  ifstream *infile_local;
  
  uStack_20 = 3;
  memset(&local_23,0,3);
  std::istream::read((char *)infile,(long)&local_23);
  if (((local_23 == -0x11) && (local_22 == -0x45)) && (local_21 == -0x41)) {
    std::fpos<__mbstate_t>::fpos(&local_38,3);
    std::istream::seekg(infile,local_38._M_off,local_38._M_state);
    infile_local._7_1_ = true;
  }
  else {
    std::fpos<__mbstate_t>::fpos(&local_48,0);
    std::istream::seekg(infile,local_48._M_off,local_48._M_state);
    infile_local._7_1_ = false;
  }
  return infile_local._7_1_;
}

Assistant:

static bool skip_bom(std::ifstream &infile) {
      size_t bytes_needed = 3;
      char buffer[3];

      memset(buffer, '\0', bytes_needed);

      infile.read(buffer, static_cast<std::streamsize>(bytes_needed));

      if ((buffer[0] == '\xef') && (buffer[1] == '\xbb') && (buffer[2] == '\xbf')) {
        infile.seekg(3);
        return true;
      }

      infile.seekg(0);

      return false;
    }